

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeMemSetAtomicAccessAttributeExpPrologue
          (ZEHandleLifetimeValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          void *ptr,size_t size,ze_memory_atomic_attr_exp_flags_t attr)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hContext);
  zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar2) {
    bVar2 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hDevice);
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    if (bVar2) {
      zVar3 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeMemSetAtomicAccessAttributeExpPrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of context
        ze_device_handle_t hDevice,                     ///< [in] device associated with the memory advice
        const void* ptr,                                ///< [in] Pointer to the start of the memory range
        size_t size,                                    ///< [in] Size in bytes of the memory range
        ze_memory_atomic_attr_exp_flags_t attr          ///< [in] Atomic access attributes to set for the specified range.
                                                        ///< Must be 0 (default) or a valid combination of ::ze_memory_atomic_attr_exp_flag_t.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }